

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaction.cpp
# Opt level: O1

void __thiscall QAction::setWhatsThis(QAction *this,QString *whatsthis)

{
  QActionPrivate *this_00;
  long lVar1;
  long lVar2;
  char cVar3;
  QStringView QVar4;
  QStringView QVar5;
  
  this_00 = *(QActionPrivate **)&this->field_0x8;
  lVar1 = (this_00->whatsthis).d.size;
  lVar2 = (whatsthis->d).size;
  if (lVar1 == lVar2) {
    QVar4.m_data = (this_00->whatsthis).d.ptr;
    QVar4.m_size = lVar1;
    QVar5.m_data = (whatsthis->d).ptr;
    QVar5.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
    if (cVar3 != '\0') {
      return;
    }
  }
  QString::operator=(&this_00->whatsthis,whatsthis);
  QActionPrivate::sendDataChanged(this_00);
  return;
}

Assistant:

void QAction::setWhatsThis(const QString &whatsthis)
{
    Q_D(QAction);
    if (d->whatsthis == whatsthis)
        return;

    d->whatsthis = whatsthis;
    d->sendDataChanged();
}